

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall
HModel::util_extractCols
          (HModel *this,int firstcol,int lastcol,double *XcolLower,double *XcolUpper,int *nnonz,
          int *XAstart,int *XAindex,double *XAvalue)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  int *in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  int el;
  int col;
  int elOs;
  int local_34;
  uint local_30;
  
  printf("Called model.util_extractCols(firstcol=%d, lastcol=%d)\n",(ulong)in_ESI,(ulong)in_EDX);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(int)in_ESI);
  iVar1 = *pvVar2;
  for (local_30 = in_ESI; (int)local_30 <= (int)in_EDX; local_30 = local_30 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                        (long)(int)local_30);
    *(value_type *)(in_RCX + (long)(int)(local_30 - in_ESI) * 8) = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                        (long)(int)local_30);
    *(value_type *)(in_R8 + (long)(int)(local_30 - in_ESI) * 8) = *pvVar3;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(int)local_30);
    *(value_type *)(in_stack_00000008 + (long)(int)(local_30 - in_ESI) * 4) = *pvVar2 - iVar1;
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(int)in_ESI);
  local_34 = *pvVar2;
  while( true ) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                        (long)(int)(in_EDX + 1));
    if (*pvVar2 <= local_34) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_34);
    *(value_type *)(in_stack_00000010 + (long)(local_34 - iVar1) * 4) = *pvVar2;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),(long)local_34);
    *(value_type *)(_col + (long)(local_34 - iVar1) * 8) = *pvVar3;
    local_34 = local_34 + 1;
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),(long)(int)(in_EDX + 1))
  ;
  *in_R9 = *pvVar2 - iVar1;
  return;
}

Assistant:

void HModel::util_extractCols(int firstcol, int lastcol, double* XcolLower, double* XcolUpper,
			  int* nnonz, int* XAstart, int* XAindex, double* XAvalue) {
  assert(firstcol >= 0);
  assert(lastcol < numCol);
  assert(firstcol <= lastcol);
#ifdef JAJH_dev
  printf("Called model.util_extractCols(firstcol=%d, lastcol=%d)\n", firstcol, lastcol);cout << flush;
#endif
  //Determine the number of columns to be extracted
  //int numExtractCols = lastcol-firstcol+1;
  //printf("Extracting %d columns\n", numExtractCols);cout << flush;
  int elOs = Astart[firstcol];
  for (int col = firstcol; col <= lastcol; col++) {
    //    printf("Extracting column %d\n", col);cout << flush;
    XcolLower[col-firstcol] = colLower[col];
    XcolUpper[col-firstcol] = colUpper[col];
    XAstart[col-firstcol] = Astart[col]-elOs;
  }
  for (int el = Astart[firstcol]; el < Astart[lastcol+1]; el++) {
    XAindex[el-elOs] = Aindex[el];
    XAvalue[el-elOs] = Avalue[el];
  }
  *nnonz = Astart[lastcol+1]-elOs;
}